

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O1

void __thiscall xray_re::xr_swibuf::load(xr_swibuf *this,xr_reader *r)

{
  ogf4_slide_window *poVar1;
  uint8_t *puVar2;
  ogf4_slide_window *p;
  long lVar3;
  ogf4_slide_window *poVar4;
  uint16_t *puVar5;
  ulong uVar6;
  
  (this->super_xr_flexbuf).m_owner = true;
  (this->super_xr_flexbuf).m_size = 0;
  lVar3 = 0;
  do {
    *(uint32_t *)((long)this->m_reserved + lVar3) = *(r->field_2).m_p_u32;
    puVar2 = (r->field_2).m_p;
    (r->field_2).m_p = puVar2 + 4;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  (r->field_2).m_p = puVar2 + 8;
  uVar6 = (ulong)*(uint *)(puVar2 + 4);
  if (uVar6 != 0) {
    poVar4 = (ogf4_slide_window *)operator_new__(uVar6 * 8);
    this->m_slide_windows = poVar4;
    poVar1 = poVar4 + uVar6;
    puVar5 = (uint16_t *)((r->field_2).m_p + 4);
    do {
      (r->field_2).m_p_u16 = puVar5;
      poVar4->offset = *(uint32_t *)(puVar5 + -2);
      (r->field_2).m_p = (uint8_t *)(puVar5 + 1);
      poVar4->num_tris = *puVar5;
      (r->field_2).m_p = (uint8_t *)(puVar5 + 2);
      poVar4->num_verts = puVar5[1];
      poVar4 = poVar4 + 1;
      puVar5 = puVar5 + 4;
    } while (poVar4 != poVar1);
    return;
  }
  __assert_fail("n > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                ,0x218,"void xray_re::xr_swibuf::load(xr_reader &)");
}

Assistant:

void xr_swibuf::load(xr_reader& r)
{
	xr_flexbuf::clear();
	r.r_cseq<uint32_t>(4, m_reserved);
	size_t n = r.r_u32();
	xr_assert(n > 0);
	m_slide_windows = new ogf4_slide_window[n];
	r.r_cseq(n, m_slide_windows, read_sw());
}